

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::python::Generator::OptionsValue
          (string *__return_storage_ptr__,Generator *this,string *serialized_options)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  if ((serialized_options->_M_string_length != 0) &&
     (bVar1 = GeneratingDescriptorProto(this), !bVar1)) {
    CEscape(&local_38,serialized_options);
    std::operator+(&bStack_58,"b\'",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58,"\'");
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,"None",(allocator *)&bStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string Generator::OptionsValue(
    const std::string& serialized_options) const {
  if (serialized_options.length() == 0 || GeneratingDescriptorProto()) {
    return "None";
  } else {
    return "b'" + CEscape(serialized_options) + "'";
  }
}